

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O2

void CoreML::Specification::protobuf_DataStructures_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_003a35d8 == '\x01') {
    DAT_003a35d8 = '\0';
    (*(code *)*_StringToInt64Map_default_instance_)();
  }
  if (DAT_003a3650 == '\x01') {
    DAT_003a3650 = '\0';
    (*(code *)*_Int64ToStringMap_default_instance_)();
  }
  if (DAT_003a36c8 == '\x01') {
    DAT_003a36c8 = '\0';
    (*(code *)*_StringToDoubleMap_default_instance_)();
  }
  if (DAT_003a3740 == '\x01') {
    DAT_003a3740 = '\0';
    (*(code *)*_Int64ToDoubleMap_default_instance_)();
  }
  if (DAT_003a3778 == '\x01') {
    DAT_003a3778 = '\0';
    (*(code *)*_StringVector_default_instance_)();
  }
  if (DAT_003a37a8 == '\x01') {
    DAT_003a37a8 = '\0';
    (*(code *)*_Int64Vector_default_instance_)();
  }
  if (DAT_003a37d8 == '\x01') {
    DAT_003a37d8 = '\0';
    (*(code *)*_FloatVector_default_instance_)();
  }
  if (DAT_003a3808 == '\x01') {
    DAT_003a3808 = '\0';
    (*(code *)*_DoubleVector_default_instance_)();
  }
  if (DAT_003a3838 == '\x01') {
    DAT_003a3838 = '\0';
    (*(code *)*_Int64Range_default_instance_)();
  }
  if (DAT_003a3868 == '\x01') {
    DAT_003a3868 = '\0';
    (*(code *)*_Int64Set_default_instance_)();
  }
  if (DAT_003a3898 == '\x01') {
    DAT_003a3898 = 0;
    (*(code *)*_DoubleRange_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _StringToInt64Map_default_instance_.Shutdown();
  _Int64ToStringMap_default_instance_.Shutdown();
  _StringToDoubleMap_default_instance_.Shutdown();
  _Int64ToDoubleMap_default_instance_.Shutdown();
  _StringVector_default_instance_.Shutdown();
  _Int64Vector_default_instance_.Shutdown();
  _FloatVector_default_instance_.Shutdown();
  _DoubleVector_default_instance_.Shutdown();
  _Int64Range_default_instance_.Shutdown();
  _Int64Set_default_instance_.Shutdown();
  _DoubleRange_default_instance_.Shutdown();
}